

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

APInt * __thiscall llvm::APInt::operator=(APInt *this,APInt *that)

{
  if (this != that) {
    if ((0x40 < this->BitWidth) && ((this->U).pVal != (uint64_t *)0x0)) {
      operator_delete__((this->U).pVal);
    }
    this->U = that->U;
    this->BitWidth = that->BitWidth;
    that->BitWidth = 0;
    return this;
  }
  __assert_fail("this != &that && \"Self-move not supported\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x2f1,"APInt &llvm::APInt::operator=(APInt &&)");
}

Assistant:

APInt &operator=(APInt &&that) {
#ifdef _MSC_VER
    // The MSVC std::shuffle implementation still does self-assignment.
    if (this == &that)
      return *this;
#endif
    assert(this != &that && "Self-move not supported");
    if (!isSingleWord())
      delete[] U.pVal;

    // Use memcpy so that type based alias analysis sees both VAL and pVal
    // as modified.
    memcpy(&U, &that.U, sizeof(U));

    BitWidth = that.BitWidth;
    that.BitWidth = 0;

    return *this;
  }